

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  LogMessage *pLVar1;
  Message *pMVar2;
  MutexLock local_60;
  MutexLock lock;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  Descriptor *local_18;
  Descriptor *type_local;
  DynamicMessageFactory *this_local;
  
  local_18 = type;
  type_local = (Descriptor *)this;
  if (type != (Descriptor *)0x0) {
    absl::lts_20240722::MutexLock::MutexLock(&local_60,&this->prototypes_mutex_);
    pMVar2 = GetPrototypeNoLock(this,local_18);
    absl::lts_20240722::MutexLock::~MutexLock(&local_60);
    return pMVar2;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"type != nullptr");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/dynamic_message.cc"
             ,0x290,local_40._M_len,local_40._M_str);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar1);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  ABSL_CHECK(type != nullptr);
  absl::MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}